

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStream_EndProcessing(PaAlsaStream *self,unsigned_long numFrames,int *xrunOccurred)

{
  snd_pcm_channel_area_t *psVar1;
  snd_pcm_uframes_t sVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  void *__s;
  PaError PVar6;
  void *pvVar7;
  char *format;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  int xrun;
  int local_54;
  ulong local_50;
  int local_44;
  undefined8 local_40;
  int *local_38;
  
  local_54 = 0;
  if (((self->capture).pcm == (snd_pcm_t *)0x0) ||
     (paUtilErr_ = PaAlsaStreamComponent_EndProcessing(&self->capture,numFrames,&local_54),
     -1 < paUtilErr_)) {
    PVar6 = 0;
    if ((self->playback).pcm == (snd_pcm_t *)0x0) goto LAB_00113843;
    if ((self->playback).numUserChannels < (self->playback).numHostChannels) {
      uVar9 = (self->playback).numHostChannels;
      if ((self->playback).streamDir != StreamDirection_Out) {
        __assert_fail("StreamDirection_Out == self->streamDir",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0xdc5,
                      "PaError PaAlsaStreamComponent_DoChannelAdaption(PaAlsaStreamComponent *, PaUtilBufferProcessor *, int)"
                     );
      }
      iVar3 = (self->playback).numUserChannels;
      iVar8 = uVar9 - iVar3;
      bVar11 = (uVar9 & 1) == 0 & (byte)iVar3;
      local_50 = numFrames;
      local_38 = xrunOccurred;
      if ((self->playback).hostInterleaved == 0) {
        if (bVar11 != 0) {
          psVar1 = (self->playback).channelAreas;
          sVar2 = (self->playback).offset;
          iVar3 = snd_pcm_area_copy(psVar1 + iVar3,sVar2,psVar1 + (long)iVar3 + -1,sVar2,
                                    numFrames & 0xffffffff,(self->playback).nativeFormat);
          if (iVar3 < 0) {
            PaAlsaStream_EndProcessing_cold_1();
            iVar3 = -9999;
            goto LAB_00113809;
          }
          iVar8 = iVar8 + -1;
        }
        iVar3 = 0;
        if (0 < iVar8) {
          snd_pcm_areas_silence
                    ((self->playback).channelAreas +
                     ((long)(self->playback).numHostChannels - (long)iVar8),(self->playback).offset,
                     iVar8,(long)(int)numFrames,(self->playback).nativeFormat);
        }
      }
      else {
        uVar5 = snd_pcm_format_size((self->playback).nativeFormat);
        if ((self->playback).canMmap == 0) {
          pvVar7 = (self->playback).nonMmapBuffer;
        }
        else {
          psVar1 = (self->playback).channelAreas;
          pvVar7 = (void *)(((ulong)psVar1->step * (self->playback).offset + (ulong)psVar1->first >>
                            3) + (long)psVar1->addr);
        }
        iVar3 = (self->playback).numUserChannels;
        iVar4 = (int)uVar5;
        __s = (void *)((long)(iVar3 * iVar4) + (long)pvVar7);
        if (bVar11 != 0) {
          local_44 = iVar8;
          local_40 = uVar5;
          if (0 < (int)numFrames) {
            pvVar7 = (void *)((long)pvVar7 + (long)((iVar3 + -1) * iVar4));
            uVar10 = local_50 & 0xffffffff;
            do {
              memcpy((void *)((long)pvVar7 + (long)iVar4),pvVar7,(long)iVar4);
              pvVar7 = (void *)((long)pvVar7 + (long)(self->playback).numHostChannels * (long)iVar4)
              ;
              uVar9 = (int)uVar10 - 1;
              uVar10 = (ulong)uVar9;
            } while (uVar9 != 0);
          }
          __s = (void *)((long)__s + (long)(int)local_40);
          iVar8 = local_44 + -1;
          uVar5 = local_40;
          numFrames = local_50;
        }
        iVar3 = 0;
        if ((0 < (int)numFrames) && (0 < iVar8)) {
          uVar10 = local_50 & 0xffffffff;
          iVar3 = 0;
          do {
            memset(__s,0,(long)(iVar8 * (int)uVar5));
            __s = (void *)((long)__s + (long)(self->playback).numHostChannels * (long)(int)uVar5);
            uVar9 = (int)uVar10 - 1;
            uVar10 = (ulong)uVar9;
          } while (uVar9 != 0);
        }
      }
LAB_00113809:
      xrunOccurred = local_38;
      numFrames = local_50;
      paUtilErr_ = iVar3;
      if (iVar3 < 0) {
        format = 
        "Expression \'PaAlsaStreamComponent_DoChannelAdaption( &self->playback, &self->bufferProcessor, numFrames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3594\n"
        ;
        goto LAB_00113873;
      }
    }
    paUtilErr_ = PaAlsaStreamComponent_EndProcessing(&self->playback,numFrames,&local_54);
    PVar6 = 0;
    if (-1 < paUtilErr_) goto LAB_00113843;
    format = 
    "Expression \'PaAlsaStreamComponent_EndProcessing( &self->playback, numFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3596\n"
    ;
  }
  else {
    format = 
    "Expression \'PaAlsaStreamComponent_EndProcessing( &self->capture, numFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3588\n"
    ;
  }
LAB_00113873:
  PaUtil_DebugPrint(format);
  PVar6 = paUtilErr_;
LAB_00113843:
  *xrunOccurred = local_54;
  return PVar6;
}

Assistant:

static PaError PaAlsaStream_EndProcessing( PaAlsaStream *self, unsigned long numFrames, int *xrunOccurred )
{
    PaError result = paNoError;
    int xrun = 0;

    if( self->capture.pcm )
    {
        PA_ENSURE( PaAlsaStreamComponent_EndProcessing( &self->capture, numFrames, &xrun ) );
    }
    if( self->playback.pcm )
    {
        if( self->playback.numHostChannels > self->playback.numUserChannels )
        {
            PA_ENSURE( PaAlsaStreamComponent_DoChannelAdaption( &self->playback, &self->bufferProcessor, numFrames ) );
        }
        PA_ENSURE( PaAlsaStreamComponent_EndProcessing( &self->playback, numFrames, &xrun ) );
    }

error:
    *xrunOccurred = xrun;
    return result;
}